

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flvtag_amfcaption_708(flvtag_t *tag,uint32_t timestamp,sei_message_t *msg)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint8_t *in;
  uint8_t *data;
  unsigned_long size;
  sei_message_t *msg_local;
  flvtag_t *pfStack_10;
  uint32_t timestamp_local;
  flvtag_t *tag_local;
  
  size = (unsigned_long)msg;
  msg_local._4_4_ = timestamp;
  pfStack_10 = tag;
  flvtag_initamf(tag,timestamp);
  sVar1 = sei_message_size((sei_message_t *)size);
  data = (uint8_t *)(((sVar1 + 2) / 3) * 4 + 1);
  flvtag_reserve(pfStack_10,(int)data + 0x2d);
  puVar2 = flvtag_payload_data(pfStack_10);
  memcpy(puVar2,"\x02",0x2a);
  puVar2 = flvtag_payload_data(pfStack_10);
  in = sei_message_data((sei_message_t *)size);
  sVar1 = sei_message_size((sei_message_t *)size);
  base64_encode(in,sVar1,puVar2 + 0x2a,(unsigned_long *)&data);
  puVar2[0x28] = (uint8_t)((ulong)data >> 8);
  puVar2[0x29] = (uint8_t)data;
  (puVar2 + 0x2a)[(long)data] = '\0';
  (puVar2 + 0x2b)[(long)data] = '\0';
  (puVar2 + 0x2c)[(long)data] = '\t';
  flvtag_updatesize(pfStack_10,(int)data + 0x2d);
  return 1;
}

Assistant:

int flvtag_amfcaption_708(flvtag_t* tag, uint32_t timestamp, sei_message_t* msg)
{
    flvtag_initamf(tag, timestamp);
    unsigned long size = 1 + (4 * ((sei_message_size(msg) + 2) / 3));
    flvtag_reserve(tag, sizeof(onCaptionInfo708) + size + 3);
    memcpy(flvtag_payload_data(tag), onCaptionInfo708, sizeof(onCaptionInfo708));
    uint8_t* data = flvtag_payload_data(tag) + sizeof(onCaptionInfo708);
    base64_encode(sei_message_data(msg), sei_message_size(msg), data, &size);

    // Update the size of the base64 string
    data[-2] = size >> 8;
    data[-1] = size >> 0;
    // write the last array element
    data[size + 0] = 0x00;
    data[size + 1] = 0x00;
    data[size + 2] = 0x09;
    flvtag_updatesize(tag, sizeof(onCaptionInfo708) + size + 3);

    return 1;
}